

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  byte bVar1;
  uchar uVar2;
  bool bVar3;
  stbi_uc sVar4;
  int iVar5;
  uint uVar6;
  uint x_00;
  uint y_00;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uchar *puVar10;
  stbi_uc *psVar11;
  ulong uVar12;
  stbi_uc *psVar13;
  byte *pbVar14;
  ulong uVar15;
  uint uVar16;
  ulong __n;
  ulong uVar17;
  int iVar18;
  uchar *puVar19;
  byte bVar20;
  ulong __n_00;
  bool bVar21;
  bool bVar22;
  uchar raw_data [4];
  uint local_a0;
  ulong local_70;
  stbi_uc local_64 [4];
  stbi_uc *local_60;
  stbi_uc *local_58;
  ulong local_50;
  stbi_uc *local_48;
  ulong local_40;
  uint local_38;
  uint local_34;
  
  pbVar14 = s->img_buffer;
  local_34 = req_comp;
  if (pbVar14 < s->img_buffer_end) {
LAB_00112bc0:
    s->img_buffer = pbVar14 + 1;
    local_a0 = (uint)*pbVar14;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar11;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar11;
        s->img_buffer_end = psVar11 + iVar5;
      }
      pbVar14 = s->img_buffer;
      goto LAB_00112bc0;
    }
    local_a0 = 0;
  }
  psVar11 = s->img_buffer;
  if (psVar11 < s->img_buffer_end) {
LAB_00112c40:
    s->img_buffer = psVar11 + 1;
    bVar21 = *psVar11 != '\0';
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar11;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar11;
        s->img_buffer_end = psVar11 + iVar5;
      }
      psVar11 = s->img_buffer;
      goto LAB_00112c40;
    }
    bVar21 = false;
  }
  pbVar14 = s->img_buffer;
  if (pbVar14 < s->img_buffer_end) {
LAB_00112cc5:
    s->img_buffer = pbVar14 + 1;
    bVar1 = *pbVar14;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar11;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar11;
        s->img_buffer_end = psVar11 + iVar5;
      }
      pbVar14 = s->img_buffer;
      goto LAB_00112cc5;
    }
    bVar1 = 0;
  }
  iVar5 = stbi__get16le(s);
  local_60 = (stbi_uc *)CONCAT44(local_60._4_4_,iVar5);
  uVar6 = stbi__get16le(s);
  pbVar14 = s->img_buffer;
  if (pbVar14 < s->img_buffer_end) {
LAB_00112d62:
    s->img_buffer = pbVar14 + 1;
    local_70 = (ulong)*pbVar14;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar11;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar11;
        s->img_buffer_end = psVar11 + iVar5;
      }
      pbVar14 = s->img_buffer;
      goto LAB_00112d62;
    }
    local_70 = 0;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  x_00 = stbi__get16le(s);
  y_00 = stbi__get16le(s);
  pbVar14 = s->img_buffer;
  if (pbVar14 < s->img_buffer_end) {
LAB_00112e0d:
    s->img_buffer = pbVar14 + 1;
    bVar20 = *pbVar14;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar11;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar11;
        s->img_buffer_end = psVar11 + iVar5;
      }
      pbVar14 = s->img_buffer;
      goto LAB_00112e0d;
    }
    bVar20 = 0;
  }
  pbVar14 = s->img_buffer;
  if (pbVar14 < s->img_buffer_end) {
LAB_00112e9e:
    s->img_buffer = pbVar14 + 1;
    bVar22 = (*pbVar14 & 0x20) == 0;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar11;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar11;
        s->img_buffer_end = psVar11 + iVar5;
      }
      pbVar14 = s->img_buffer;
      goto LAB_00112e9e;
    }
    bVar22 = true;
  }
  uVar7 = bVar1 - 8;
  if (bVar1 < 8) {
    uVar7 = (uint)bVar1;
  }
  if (x_00 == 0) {
    return (stbi_uc *)0x0;
  }
  if (y_00 == 0) {
    return (stbi_uc *)0x0;
  }
  if (uVar7 - 4 < 0xfffffffd) {
    return (stbi_uc *)0x0;
  }
  if (3 < (byte)(bVar20 << 5 | (byte)(bVar20 - 8) >> 3)) {
    return (stbi_uc *)0x0;
  }
  local_40 = (ulong)bVar20;
  local_38 = (uint)(bVar20 >> 3);
  __n = local_70 >> 3;
  if (!bVar21) {
    __n = (ulong)local_38;
  }
  *x = x_00;
  *y = y_00;
  uVar7 = (uint)__n;
  if (comp != (int *)0x0) {
    *comp = uVar7;
  }
  local_50 = (ulong)(y_00 * x_00);
  puVar10 = (uchar *)malloc(__n * local_50);
  if (puVar10 != (uchar *)0x0) {
    stbi__skip(s,local_a0);
    if (bVar1 < 8 && !bVar21) {
      if (y_00 != 0) {
        uVar16 = 0;
        uVar6 = y_00;
        do {
          uVar6 = uVar6 - 1;
          uVar8 = uVar16;
          if (bVar22) {
            uVar8 = uVar6;
          }
          stbi__getn(s,puVar10 + (int)(uVar8 * x_00 * uVar7),x_00 * uVar7);
          uVar16 = uVar16 + 1;
        } while (uVar6 != 0);
      }
    }
    else {
      if (bVar21) {
        stbi__skip(s,(int)local_60);
        uVar16 = (int)local_70 * uVar6 >> 3;
        psVar11 = (stbi_uc *)malloc((ulong)uVar16);
        if (psVar11 == (stbi_uc *)0x0) {
          free(puVar10);
          goto LAB_001133c7;
        }
        iVar5 = stbi__getn(s,psVar11,uVar16);
        local_58 = psVar11;
        if (iVar5 == 0) {
          free(puVar10);
          free(psVar11);
          stbi__g_failure_reason = "bad palette";
          return (stbi_uc *)0x0;
        }
      }
      else {
        local_58 = (stbi_uc *)0x0;
      }
      if ((int)local_50 != 0) {
        psVar11 = s->buffer_start;
        local_48 = s->buffer_start + 1;
        __n_00 = (ulong)(((int)local_40 - 1U >> 3) + 1);
        uVar12 = local_50 & 0xffffffff;
        uVar15 = 0;
        bVar20 = 0;
        local_a0 = 0;
        iVar5 = 0;
        local_60 = psVar11;
        do {
          if (bVar1 < 8) {
LAB_00113137:
            bVar3 = false;
          }
          else {
            if (iVar5 == 0) {
              pbVar14 = s->img_buffer;
              if (pbVar14 < s->img_buffer_end) {
LAB_00113118:
                s->img_buffer = pbVar14 + 1;
                local_a0 = (uint)*pbVar14;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
                  if (iVar5 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar11;
                    s->img_buffer_end = local_48;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar11;
                    s->img_buffer_end = psVar11 + iVar5;
                  }
                  pbVar14 = s->img_buffer;
                  goto LAB_00113118;
                }
                local_a0 = 0;
              }
              iVar5 = (local_a0 & 0x7f) + 1;
              local_a0 = local_a0 >> 7;
              goto LAB_00113137;
            }
            bVar3 = (bool)(bVar20 & local_a0 != 0);
            local_a0 = (uint)(local_a0 != 0);
          }
          if (!bVar3) {
            if (bVar21) {
              pbVar14 = s->img_buffer;
              if (pbVar14 < s->img_buffer_end) {
LAB_00113263:
                s->img_buffer = pbVar14 + 1;
                uVar16 = (uint)*pbVar14;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
                  if (iVar9 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar11;
                    s->img_buffer_end = local_48;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar11;
                    s->img_buffer_end = psVar11 + iVar9;
                  }
                  pbVar14 = s->img_buffer;
                  goto LAB_00113263;
                }
                uVar16 = 0;
              }
              if ((char)local_40 != '\0') {
                if (uVar6 <= uVar16) {
                  uVar16 = 0;
                }
                memcpy(local_64,local_58 + uVar16 * local_38,__n_00);
                psVar11 = local_60;
              }
            }
            else if ((int)local_40 != 0) {
              uVar17 = 0;
              do {
                psVar13 = s->img_buffer;
                if (psVar13 < s->img_buffer_end) {
LAB_00113216:
                  s->img_buffer = psVar13 + 1;
                  sVar4 = *psVar13;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
                    if (iVar9 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar11;
                      s->img_buffer_end = local_48;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar11;
                      s->img_buffer_end = psVar11 + iVar9;
                    }
                    psVar13 = s->img_buffer;
                    goto LAB_00113216;
                  }
                  sVar4 = '\0';
                }
                local_64[uVar17] = sVar4;
                uVar17 = uVar17 + 1;
              } while (__n_00 != uVar17);
            }
          }
          if (uVar7 != 0) {
            memcpy(puVar10 + uVar7 * (int)uVar15,local_64,__n);
            psVar11 = local_60;
          }
          iVar5 = iVar5 + -1;
          uVar15 = uVar15 + 1;
          bVar20 = 1;
        } while (uVar15 != uVar12);
      }
      if (bVar22 && y_00 != 0) {
        iVar5 = x_00 * uVar7;
        iVar9 = iVar5 * (y_00 - 1);
        uVar16 = 0;
        uVar6 = 0;
        do {
          if (iVar5 != 0) {
            puVar19 = puVar10;
            iVar18 = iVar5 + 1;
            do {
              uVar2 = puVar19[uVar16];
              puVar19[uVar16] = puVar19[iVar9];
              puVar19[iVar9] = uVar2;
              puVar19 = puVar19 + 1;
              iVar18 = iVar18 + -1;
            } while (1 < iVar18);
          }
          iVar9 = iVar9 - iVar5;
          uVar16 = uVar16 + iVar5;
          bVar21 = uVar6 != y_00 - 1 >> 1;
          uVar6 = uVar6 + 1;
        } while (bVar21);
      }
      if (local_58 != (stbi_uc *)0x0) {
        free(local_58);
      }
    }
    if ((int)local_50 != 0 && 2 < uVar7) {
      puVar19 = puVar10 + 2;
      uVar12 = local_50;
      do {
        uVar2 = puVar19[-2];
        puVar19[-2] = *puVar19;
        *puVar19 = uVar2;
        puVar19 = puVar19 + __n;
        uVar6 = (int)uVar12 - 1;
        uVar12 = (ulong)uVar6;
      } while (uVar6 != 0);
    }
    if (local_34 != 0) {
      if (uVar7 != local_34) {
        puVar10 = stbi__convert_format(puVar10,uVar7,local_34,x_00,y_00);
        return puVar10;
      }
      return puVar10;
    }
    return puVar10;
  }
LAB_001133c7:
  stbi__g_failure_reason = "outofmem";
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp = tga_bits_per_pixel / 8;
   int tga_inverted = stbi__get8(s);
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4];
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   /* int tga_alpha_bits = tga_inverted & 15; */
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   error check
   if ( //(tga_indexed) ||
      (tga_width < 1) || (tga_height < 1) ||
      (tga_image_type < 1) || (tga_image_type > 3) ||
      ((tga_bits_per_pixel != 8) && (tga_bits_per_pixel != 16) &&
      (tga_bits_per_pixel != 24) && (tga_bits_per_pixel != 32))
      )
   {
      return NULL; // we don't report this as a bad TGA because we don't even know if it's TGA
   }

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed )
   {
      tga_comp = tga_palette_bits / 8;
   }

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   tga_data = (unsigned char*)stbi__malloc( (size_t)tga_width * tga_height * tga_comp );
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE) {
      for (i=0; i < tga_height; ++i) {
         int y = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + y*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc( tga_palette_len * tga_palette_bits / 8 );
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (!stbi__getn(s, tga_palette, tga_palette_len * tga_palette_bits / 8 )) {
            STBI_FREE(tga_data);
            STBI_FREE(tga_palette);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               //   read in 1 byte, then perform the lookup
               int pal_idx = stbi__get8(s);
               if ( pal_idx >= tga_palette_len )
               {
                  //   invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_bits_per_pixel / 8;
               for (j = 0; j*8 < tga_bits_per_pixel; ++j)
               {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else
            {
               //   read in the data raw
               for (j = 0; j*8 < tga_bits_per_pixel; ++j)
               {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB
   if (tga_comp >= 3)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   //   OK, done
   return tga_data;
}